

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# range.cpp
# Opt level: O1

void __thiscall
duckdb::RangeInfoStruct<duckdb::NumericRangeInfo,_true>::GetListValues
          (RangeInfoStruct<duckdb::NumericRangeInfo,_true> *this,idx_t row_idx,TYPE *start_value,
          TYPE *end_value,INCREMENT_TYPE *increment_value)

{
  long lVar1;
  INCREMENT_TYPE IVar2;
  TYPE TVar3;
  idx_t iVar4;
  
  lVar1 = *(long *)(this->args + 8) - *(long *)this->args;
  if (lVar1 == 0x68) {
    TVar3 = 0;
  }
  else {
    iVar4 = row_idx;
    if (**(long **)&this->field_0x8 != 0) {
      iVar4 = (idx_t)*(uint *)(**(long **)&this->field_0x8 + row_idx * 4);
    }
    TVar3 = *(TYPE *)(*(long *)&this->field_0x10 + iVar4 * 8);
  }
  *start_value = TVar3;
  iVar4 = row_idx;
  if (**(long **)(&this->field_0x8 + (ulong)(lVar1 != 0x68) * 0x48) != 0) {
    iVar4 = (idx_t)*(uint *)(**(long **)(&this->field_0x8 + (ulong)(lVar1 != 0x68) * 0x48) +
                            row_idx * 4);
  }
  *end_value = *(TYPE *)(*(long *)(&this->field_0x10 + (ulong)(lVar1 != 0x68) * 0x48) + iVar4 * 8);
  IVar2 = 1;
  if (2 < (ulong)((lVar1 >> 3) * 0x4ec4ec4ec4ec4ec5)) {
    if (**(long **)&this->field_0x98 != 0) {
      row_idx = (idx_t)*(uint *)(**(long **)&this->field_0x98 + row_idx * 4);
    }
    IVar2 = *(INCREMENT_TYPE *)(*(long *)&this->field_0xa0 + row_idx * 8);
  }
  *increment_value = IVar2;
  return;
}

Assistant:

typename OP::TYPE StartListValue(idx_t row_idx) {
		if (args.ColumnCount() == 1) {
			return OP::DefaultStart();
		} else {
			auto data = (typename OP::TYPE *)vdata[0].data;
			auto idx = vdata[0].sel->get_index(row_idx);
			return data[idx];
		}
	}